

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fPixelBufferObjectTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::anon_unknown_0::ReadPixelsTest::ReadPixelsTest
          (ReadPixelsTest *this,Context *context,TestSpec *spec)

{
  deUint32 seed;
  TextureChannelClass TVar1;
  char *pcVar2;
  char *description;
  TestLog *pTVar3;
  TextureFormat TVar4;
  ChannelType CStack_30;
  TestSpec *spec_local;
  Context *context_local;
  ReadPixelsTest *this_local;
  
  pcVar2 = (char *)std::__cxx11::string::c_str();
  description = (char *)std::__cxx11::string::c_str();
  gles3::TestCase::TestCase(&this->super_TestCase,context,pcVar2,description);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ReadPixelsTest_03291318;
  pcVar2 = (char *)std::__cxx11::string::c_str();
  seed = deStringHash(pcVar2);
  de::Random::Random(&this->m_random,seed);
  pTVar3 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  this->m_log = pTVar3;
  this->m_program = (ShaderProgram *)0x0;
  this->m_framebuffeType = spec->framebufferType;
  this->m_renderbufferFormat = spec->renderbufferFormat;
  this->m_texChannelClass = TEXTURECHANNELCLASS_LAST;
  this->m_useColorClears = (bool)(spec->useColorClear & 1);
  this->m_renderTriangles = (bool)(spec->renderTriangles & 1);
  this->m_colorScale = 1.0;
  if (this->m_framebuffeType == FRAMEBUFFERTYPE_NATIVE) {
    this->m_colorScale = 1.0;
  }
  else if (this->m_framebuffeType == FRAMEBUFFERTYPE_RENDERBUFFER) {
    TVar4 = glu::mapGLInternalFormat(spec->renderbufferFormat);
    CStack_30 = TVar4.type;
    TVar1 = tcu::getTextureChannelClass(CStack_30);
    this->m_texChannelClass = TVar1;
    switch(this->m_texChannelClass) {
    case TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT:
      this->m_colorScale = 1.0;
      break;
    case TEXTURECHANNELCLASS_SIGNED_INTEGER:
      this->m_colorScale = 100.0;
      break;
    case TEXTURECHANNELCLASS_UNSIGNED_INTEGER:
      this->m_colorScale = 100.0;
      break;
    case TEXTURECHANNELCLASS_FLOATING_POINT:
      this->m_colorScale = 100.0;
    }
  }
  return;
}

Assistant:

ReadPixelsTest::ReadPixelsTest (Context& context, const TestSpec& spec)
	: TestCase				(context, spec.name.c_str(), spec.description.c_str())
	, m_random				(deStringHash(spec.name.c_str()))
	, m_log					(m_testCtx.getLog())
	, m_program				(NULL)
	, m_framebuffeType		(spec.framebufferType)
	, m_renderbufferFormat	(spec.renderbufferFormat)
	, m_texChannelClass		(tcu::TEXTURECHANNELCLASS_LAST)
	, m_useColorClears		(spec.useColorClear)
	, m_renderTriangles		(spec.renderTriangles)
	, m_colorScale			(1.0f)
{

	if (m_framebuffeType == TestSpec::FRAMEBUFFERTYPE_NATIVE)
	{
		m_colorScale = 1.0f;
	}
	else if (m_framebuffeType == TestSpec::FRAMEBUFFERTYPE_RENDERBUFFER)
	{
		m_texChannelClass = tcu::getTextureChannelClass(glu::mapGLInternalFormat(spec.renderbufferFormat).type);
		switch (m_texChannelClass)
		{
			case tcu::TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT:
				m_colorScale = 1.0f;
				break;

			case tcu::TEXTURECHANNELCLASS_SIGNED_INTEGER:
				m_colorScale = 100.0f;
				break;

			case tcu::TEXTURECHANNELCLASS_UNSIGNED_INTEGER:
				m_colorScale = 100.0f;
				break;

			case tcu::TEXTURECHANNELCLASS_FLOATING_POINT:
				m_colorScale = 100.0f;
				break;

			default:
				DE_ASSERT(false);
		}
	}
	else
		DE_ASSERT(false);
}